

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O3

vector<std::reference_wrapper<duckdb::SecretStorage>,_true> * __thiscall
duckdb::SecretManager::GetSecretStorages
          (vector<std::reference_wrapper<duckdb::SecretStorage>,_true> *__return_storage_ptr__,
          SecretManager *this)

{
  pointer *pprVar1;
  _Hash_node_base *p_Var2;
  iterator __position;
  int iVar3;
  type in_RAX;
  reference_wrapper<duckdb::SecretStorage> local_28;
  
  local_28._M_data = in_RAX;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->manager_lock);
  if (iVar3 == 0) {
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var2 = (this->secret_storages)._M_h._M_before_begin._M_nxt;
        p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
      local_28._M_data =
           unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>::
           operator*((unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>
                      *)(p_Var2 + 5));
      __position._M_current =
           (__return_storage_ptr__->
           super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
          ).
          super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::SecretStorage>,std::allocator<std::reference_wrapper<duckdb::SecretStorage>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::SecretStorage>>
                  ((vector<std::reference_wrapper<duckdb::SecretStorage>,std::allocator<std::reference_wrapper<duckdb::SecretStorage>>>
                    *)__return_storage_ptr__,__position,&local_28);
      }
      else {
        (__position._M_current)->_M_data = local_28._M_data;
        pprVar1 = &(__return_storage_ptr__->
                   super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->manager_lock);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

vector<reference<SecretStorage>> SecretManager::GetSecretStorages() {
	lock_guard<mutex> lock(manager_lock);

	vector<reference<SecretStorage>> result;

	for (const auto &storage : secret_storages) {
		result.push_back(*storage.second);
	}

	return result;
}